

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2region_intersection.cc
# Opt level: O3

void __thiscall
S2RegionIntersection::S2RegionIntersection(S2RegionIntersection *this,S2RegionIntersection *src)

{
  __uniq_ptr_impl<S2Region,_std::default_delete<S2Region>_> _Var1;
  __uniq_ptr_impl<S2Region,_std::default_delete<S2Region>_> _Var2;
  long lVar3;
  pointer puVar4;
  allocator_type local_29;
  
  (this->super_S2Region)._vptr_S2Region = (_func_int **)&PTR__S2RegionIntersection_002bcfe0;
  std::
  vector<std::unique_ptr<S2Region,_std::default_delete<S2Region>_>,_std::allocator<std::unique_ptr<S2Region,_std::default_delete<S2Region>_>_>_>
  ::vector(&this->regions_,
           (long)(int)((ulong)((long)(src->regions_).
                                     super__Vector_base<std::unique_ptr<S2Region,_std::default_delete<S2Region>_>,_std::allocator<std::unique_ptr<S2Region,_std::default_delete<S2Region>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                              (long)(src->regions_).
                                    super__Vector_base<std::unique_ptr<S2Region,_std::default_delete<S2Region>_>,_std::allocator<std::unique_ptr<S2Region,_std::default_delete<S2Region>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start) >> 3),&local_29);
  puVar4 = (this->regions_).
           super__Vector_base<std::unique_ptr<S2Region,_std::default_delete<S2Region>_>,_std::allocator<std::unique_ptr<S2Region,_std::default_delete<S2Region>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (0 < (int)((ulong)((long)(this->regions_).
                              super__Vector_base<std::unique_ptr<S2Region,_std::default_delete<S2Region>_>,_std::allocator<std::unique_ptr<S2Region,_std::default_delete<S2Region>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish - (long)puVar4) >> 3)) {
    lVar3 = 0;
    do {
      _Var2._M_t.super__Tuple_impl<0UL,_S2Region_*,_std::default_delete<S2Region>_>.
      super__Head_base<0UL,_S2Region_*,_false>._M_head_impl =
           (tuple<S2Region_*,_std::default_delete<S2Region>_>)
           (**(code **)(*(long *)(src->regions_).
                                 super__Vector_base<std::unique_ptr<S2Region,_std::default_delete<S2Region>_>,_std::allocator<std::unique_ptr<S2Region,_std::default_delete<S2Region>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start[lVar3]._M_t.
                                 super___uniq_ptr_impl<S2Region,_std::default_delete<S2Region>_>.
                                 _M_t + 0x10))();
      _Var1._M_t.super__Tuple_impl<0UL,_S2Region_*,_std::default_delete<S2Region>_>.
      super__Head_base<0UL,_S2Region_*,_false>._M_head_impl =
           puVar4[lVar3]._M_t.super___uniq_ptr_impl<S2Region,_std::default_delete<S2Region>_>._M_t;
      puVar4[lVar3]._M_t.super___uniq_ptr_impl<S2Region,_std::default_delete<S2Region>_>._M_t =
           _Var2._M_t.super__Tuple_impl<0UL,_S2Region_*,_std::default_delete<S2Region>_>.
           super__Head_base<0UL,_S2Region_*,_false>._M_head_impl;
      if ((_Tuple_impl<0UL,_S2Region_*,_std::default_delete<S2Region>_>)
          _Var1._M_t.super__Tuple_impl<0UL,_S2Region_*,_std::default_delete<S2Region>_>.
          super__Head_base<0UL,_S2Region_*,_false>._M_head_impl != (S2Region *)0x0) {
        (**(code **)(*(long *)_Var1._M_t.
                              super__Tuple_impl<0UL,_S2Region_*,_std::default_delete<S2Region>_>.
                              super__Head_base<0UL,_S2Region_*,_false>._M_head_impl + 8))();
      }
      lVar3 = lVar3 + 1;
      puVar4 = (this->regions_).
               super__Vector_base<std::unique_ptr<S2Region,_std::default_delete<S2Region>_>,_std::allocator<std::unique_ptr<S2Region,_std::default_delete<S2Region>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
    } while (lVar3 < (int)((ulong)((long)(this->regions_).
                                         super__Vector_base<std::unique_ptr<S2Region,_std::default_delete<S2Region>_>,_std::allocator<std::unique_ptr<S2Region,_std::default_delete<S2Region>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_finish - (long)puVar4)
                          >> 3));
  }
  return;
}

Assistant:

S2RegionIntersection::S2RegionIntersection(const S2RegionIntersection& src)
  : regions_(src.num_regions()) {
  for (int i = 0; i < num_regions(); ++i) {
    regions_[i].reset(src.region(i)->Clone());
  }
}